

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_file.c
# Opt level: O2

ion_boolean_t
flat_file_predicate_within_bounds(ion_flat_file_t *flat_file,ion_flat_file_row_t *row,va_list *args)

{
  uint uVar1;
  ion_key_t pvVar2;
  char cVar3;
  undefined8 *puVar4;
  ulong uVar5;
  ion_key_t pvVar6;
  
  uVar1 = (*args)[0].gp_offset;
  uVar5 = (ulong)uVar1;
  if (uVar5 < 0x29) {
    (*args)[0].gp_offset = (uint)(uVar5 + 8);
    pvVar6 = *(ion_key_t *)((long)(*args)[0].reg_save_area + uVar5);
    if (uVar1 < 0x21) {
      puVar4 = (undefined8 *)(uVar5 + 8 + (long)(*args)[0].reg_save_area);
      (*args)[0].gp_offset = uVar1 + 0x10;
      goto LAB_00106d16;
    }
  }
  else {
    puVar4 = (undefined8 *)(*args)[0].overflow_arg_area;
    (*args)[0].overflow_arg_area = puVar4 + 1;
    pvVar6 = (ion_key_t)*puVar4;
  }
  puVar4 = (undefined8 *)(*args)[0].overflow_arg_area;
  (*args)[0].overflow_arg_area = puVar4 + 1;
LAB_00106d16:
  if (row->row_status == '\x01') {
    pvVar2 = (ion_key_t)*puVar4;
    cVar3 = (*(flat_file->super).compare)(row->key,pvVar6,(flat_file->super).record.key_size);
    if (-1 < cVar3) {
      cVar3 = (*(flat_file->super).compare)(row->key,pvVar2,(flat_file->super).record.key_size);
      return cVar3 < '\x01';
    }
  }
  return '\0';
}

Assistant:

ion_boolean_t
flat_file_predicate_within_bounds(
	ion_flat_file_t		*flat_file,
	ion_flat_file_row_t *row,
	va_list				*args
) {
	ion_key_t	lower_bound = va_arg(*args, ion_key_t);
	ion_key_t	upper_bound = va_arg(*args, ion_key_t);

	return ION_FLAT_FILE_STATUS_OCCUPIED == row->row_status && flat_file->super.compare(row->key, lower_bound, flat_file->super.record.key_size) >= 0 && flat_file->super.compare(row->key, upper_bound, flat_file->super.record.key_size) <= 0;
}